

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::gen_index_of
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int forward,
          int count_only)

{
  int iVar1;
  CVmObjVector *pCVar2;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  int in_R8D;
  int in_R9D;
  vm_val_t ele;
  int val_cnt;
  size_t idx;
  size_t cnt;
  vm_val_t *val;
  undefined4 in_stack_ffffffffffffff78;
  vm_obj_id_t in_stack_ffffffffffffff7c;
  CVmRun *in_stack_ffffffffffffff80;
  CVmObjVector *this_00;
  vm_val_t *in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  int local_4c;
  CVmObjVector *local_48;
  
  if ((gen_index_of(unsigned_int,vm_val_t*,unsigned_int*,int,int)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&gen_index_of(unsigned_int,vm_val_t*,unsigned_int*,int,int)::desc)
     , iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&gen_index_of::desc,1);
    __cxa_guard_release(&gen_index_of(unsigned_int,vm_val_t*,unsigned_int*,int,int)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)in_stack_ffffffffffffff80,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar1 != 0) {
    return 1;
  }
  CVmStack::get(0);
  CVmRun::push_obj(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  vm_val_t::set_nil(in_RDX);
  local_4c = 0;
  pCVar2 = (CVmObjVector *)get_element_count((CVmObjVector *)0x34f91b);
  this_00 = pCVar2;
  local_48 = pCVar2;
  if (in_R8D != 0) {
    this_00 = (CVmObjVector *)0x0;
    local_48 = (CVmObjVector *)0x0;
  }
  do {
    if (in_R8D == 0) {
      if (local_48 == (CVmObjVector *)0x0) goto LAB_0034f9ec;
    }
    else if (pCVar2 <= local_48) goto LAB_0034f9ec;
    if (in_R8D == 0) {
      local_48 = (CVmObjVector *)
                 ((long)&local_48[-1].super_CVmObjCollection.super_CVmObject.ext_ + 7);
    }
    get_element(this_00,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                (vm_val_t *)0x34f98f);
    iVar1 = vm_val_t::equals(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             (int)((ulong)in_RDI >> 0x20));
    if (iVar1 != 0) {
      if (in_R9D == 0) {
        vm_val_t::set_int(in_RDX,(int)local_48 + 1);
LAB_0034f9ec:
        CVmStack::discard(2);
        if (in_R9D == 0) {
          return 1;
        }
        vm_val_t::set_int(in_RDX,local_4c);
        return 1;
      }
      local_4c = local_4c + 1;
    }
    if (in_R8D != 0) {
      local_48 = (CVmObjVector *)
                 ((long)&(local_48->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + 1);
    }
  } while( true );
}

Assistant:

int CVmObjVector::gen_index_of(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc, int forward, int count_only)
{
    const vm_val_t *val;
    size_t cnt;
    size_t idx;
    int val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value, but leave it on the stack */
    val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* presume we won't find a matching element */
    retval->set_nil();
    val_cnt = 0;

    /* get the number of elements to visit */
    cnt = get_element_count();

    /* start at the first or last element, depending on the direction */
    idx = (forward ? 0 : cnt);

    /* scan the list, looking for the element */
    for (;;)
    {
        vm_val_t ele;

        /* if we've reached the last element, stop looking */
        if (forward ? idx >= cnt : idx == 0)
            break;

        /* if we're going backwards, move to the next element position */
        if (!forward)
            --idx;

        /* get this element */
        get_element(idx, &ele);

        /* if the element matches the search value, return its index */
        if (ele.equals(vmg_ val))
        {
            /* it matches - see what we're doing */
            if (count_only)
            {
                /* they only want the count */
                ++val_cnt;
            }
            else
            {
                /* this is the one - return its 1-based index */
                retval->set_int(idx + 1);
                
                /* foind it - no need to keep searching */
                break;
            }
        }

        /* if we're going forwards, move to the next element */
        if (forward)
            ++idx;
    }

    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count if desired */
    if (count_only)
        retval->set_int(val_cnt);
    
    /* handled */
    return TRUE;
}